

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerPool.cpp
# Opt level: O1

PoolHandle __thiscall TimerPool::Create(TimerPool *this,string *name)

{
  TimerPool *this_00;
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  PoolHandle PVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  peVar2 = (element_type *)operator_new(0xb8);
  (peVar2->super_enable_shared_from_this<TimerPool>)._M_weak_this.
  super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x100000001;
  peVar2->_vptr_TimerPool = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109b38;
  this_00 = (TimerPool *)
            &(peVar2->super_enable_shared_from_this<TimerPool>)._M_weak_this.
             super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  TimerPool(this_00,name);
  (peVar2->super_enable_shared_from_this<TimerPool>)._M_weak_this.
  super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__TimerPool_00109b88;
  lVar1 = *(long *)((long)&(peVar2->m_mutex).super___mutex_base._M_mutex + 8);
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2;
  if ((lVar1 == 0) || (_Var3._M_pi = extraout_RDX, *(int *)(lVar1 + 8) == 0)) {
    (peVar2->m_mutex).super___mutex_base._M_mutex.__align = (long)this_00;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(peVar2->m_mutex).super___mutex_base._M_mutex + 8),&local_28);
    _Var3._M_pi = extraout_RDX_00;
  }
  this->_vptr_TimerPool = (_func_int **)this_00;
  (this->super_enable_shared_from_this<TimerPool>)._M_weak_this.
  super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<TimerPool>)._M_weak_this.
  super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_28._M_pi;
  PVar4.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  PVar4.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PoolHandle)PVar4.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerPool::PoolHandle TimerPool::Create(const std::string& name)
{
    return std::make_shared<EnableConstructor<TimerPool>>(name);
}